

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void sysbvm_context_destroy(sysbvm_context_t *context)

{
  uint8_t *puVar1;
  sysbvm_gdb_jit_code_entry_t *entry;
  ulong uVar2;
  
  if (context != (sysbvm_context_t *)0x0) {
    if ((context->jittedObjectFileEntries).size != 0) {
      puVar1 = (context->jittedObjectFileEntries).data;
      uVar2 = 0;
      do {
        entry = *(sysbvm_gdb_jit_code_entry_t **)(puVar1 + uVar2 * 8);
        sysbvm_gdb_unregisterObjectFile(entry);
        free(entry);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (context->jittedObjectFileEntries).size);
    }
    sysbvm_dynarray_destroy(&context->jittedObjectFileEntries);
    if ((context->jittedRegisteredFrames).size != 0) {
      puVar1 = (context->jittedRegisteredFrames).data;
      uVar2 = 0;
      do {
        __deregister_frame(*(undefined8 *)(puVar1 + uVar2 * 8));
        uVar2 = uVar2 + 1;
      } while (uVar2 < (context->jittedRegisteredFrames).size);
    }
    sysbvm_dynarray_destroy(&context->jittedRegisteredFrames);
    sysbvm_dynarray_destroy(&context->markingStack);
    sysbvm_heap_destroy(&context->heap);
    free(context);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_context_destroy(sysbvm_context_t *context)
{
    if(!context) return;

    // Unregister the jitted object codes.
    {
        sysbvm_gdb_jit_code_entry_t **registeredEntries = (sysbvm_gdb_jit_code_entry_t**)context->jittedObjectFileEntries.data;
        for(size_t i = 0; i < context->jittedObjectFileEntries.size; ++i)
        {
            sysbvm_gdb_jit_code_entry_t *entry = registeredEntries[i];
            sysbvm_gdb_unregisterObjectFile(entry);
            free(entry);
        }
        sysbvm_dynarray_destroy(&context->jittedObjectFileEntries);
    }

    // Unregister the jitted registered frames.
    {
        void **registeredFrames = (void **)context->jittedRegisteredFrames.data;
        for(size_t i = 0; i < context->jittedRegisteredFrames.size; ++i)
        {
#ifdef _WIN32
#else
            __deregister_frame(registeredFrames[i]);
#endif
        }
        sysbvm_dynarray_destroy(&context->jittedRegisteredFrames);
    }

    // Destroy the context heap.
    sysbvm_dynarray_destroy(&context->markingStack);
    sysbvm_heap_destroy(&context->heap);
    free(context);
}